

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O1

err_t cvrExtr(int argc,char **argv)

{
  char **names;
  bool_t bVar1;
  u32 uVar2;
  err_t eVar3;
  size_t sVar4;
  cmd_sig_t *sig;
  char *pcVar5;
  size_t ring_len;
  size_t cert_len;
  size_t offset;
  size_t sig_len;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  size_t local_30;
  
  eVar3 = 0x25b;
  if (argc == 3) {
    pcVar5 = *argv;
    bVar1 = strStartsWith(pcVar5,"-cert");
    if (bVar1 != 0) {
      sVar4 = strLen("-cert");
      pcVar5 = pcVar5 + sVar4;
      bVar1 = decIsValid(pcVar5);
      if (((bVar1 != 0) && (sVar4 = strLen(pcVar5), sVar4 != 0)) &&
         (sVar4 = strLen(pcVar5), sVar4 < 9)) {
        uVar2 = decToU32(pcVar5);
        names = argv + 1;
        eVar3 = cmdFileValExist(1,names);
        if (eVar3 == 0) {
          eVar3 = cmdFileValNotExist(1,argv + 2);
          if ((eVar3 == 0) && (eVar3 = cmdFileReadAll((void *)0x0,&local_48,*names), eVar3 == 0)) {
            sVar4 = 0x630;
            if (0x630 < local_48) {
              sVar4 = local_48;
            }
            sig = (cmd_sig_t *)blobCreate(sVar4);
            if (sig == (cmd_sig_t *)0x0) {
              eVar3 = 0x6e;
            }
            else {
              eVar3 = cmdSigRead(sig,&local_30,*names);
              if (((eVar3 == 0) && (eVar3 = cmdFileReadAll(sig,&local_48,*names), eVar3 == 0)) &&
                 (eVar3 = cmdCVCsGet(&local_38,&local_40,(octet *)sig,local_48 - local_30,
                                     (ulong)uVar2), eVar3 == 0)) {
                eVar3 = cmdFileWrite(argv[2],sig->sig + local_38,local_40);
              }
              blobClose(sig);
            }
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

static err_t cvrExtr(int argc, char* argv[])
{
	err_t code;
	const char* scope;
	size_t num;
	void* stack;
	size_t sig_len;
	cmd_sig_t* sig;
	size_t ring_len;
	octet* certs;
	size_t offset;
	size_t cert_len;
	// обработать опции
	scope = argv[0];
	if (argc != 3 || !strStartsWith(scope, "-cert"))
		return ERR_CMD_PARAMS;
	scope += strLen("-cert");
	// определить номер сертификата
	if (!decIsValid(scope) || strLen(scope) < 1 || strLen(scope) > 8)
		return ERR_CMD_PARAMS;
	num = (size_t)decToU32(scope);
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(1, argv + 1);
	ERR_CALL_CHECK(code);
	code = cmdFileValNotExist(1, argv + 2);
	ERR_CALL_CHECK(code);
	// определить длину кольца
	code = cmdFileReadAll(0, &ring_len, argv[1]);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, MAX2(sizeof(cmd_sig_t), ring_len));
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	certs = (octet*)stack;
	// определить длину подписи
	code = cmdSigRead(sig, &sig_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// прочитать кольцо
	code = cmdFileReadAll(certs, &ring_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// найти сертификат
	code = cmdCVCsGet(&offset, &cert_len, certs, ring_len - sig_len, num);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// записать сертификат в файл
	code = cmdFileWrite(argv[2], certs + offset, cert_len);
	// завершить
	cmdBlobClose(stack);
	return code;
}